

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::
     __sort<QList<QDnsServiceRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
               (iterator __first,iterator __last,
               _Iter_comp_iter<bool_(*)(const_QDnsServiceRecord_&,_const_QDnsServiceRecord_&)>
               __comp)

{
  long lVar1;
  ulong uVar2;
  
  if (__first.i != __last.i) {
    uVar2 = (long)__last.i - (long)__first.i >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    __introsort_loop<QList<QDnsServiceRecord>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,__comp);
    __final_insertion_sort<QList<QDnsServiceRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
              (__first,__last,__comp);
    return;
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }